

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_ocb.c
# Opt level: O0

int aes_ocb_cipher(void *vctx,uchar *out,size_t *outl,size_t outsize,uchar *in,size_t inl)

{
  int iVar1;
  PROV_AES_OCB_CTX *in_RCX;
  undefined8 *in_RDX;
  uchar *in_RDI;
  char *in_R8;
  PROV_AES_OCB_CTX *in_R9;
  PROV_AES_OCB_CTX *ctx;
  uchar *in_stack_ffffffffffffffb8;
  undefined4 local_4;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (in_RCX < in_R9) {
    ERR_new();
    ERR_set_debug(in_R8,(int)((ulong)in_R9 >> 0x20),(char *)in_RDI);
    ERR_set_error(0x39,0x6a,(char *)0x0);
    local_4 = 0;
  }
  else {
    iVar1 = aes_generic_ocb_cipher(in_R9,in_RDI,in_stack_ffffffffffffffb8,0x2f4ef4);
    if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug(in_R8,(int)((ulong)in_R9 >> 0x20),(char *)in_RDI);
      ERR_set_error(0x39,0x66,(char *)0x0);
      local_4 = 0;
    }
    else {
      *in_RDX = in_R9;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int aes_ocb_cipher(void *vctx, unsigned char *out, size_t *outl,
                          size_t outsize, const unsigned char *in, size_t inl)
{
    PROV_AES_OCB_CTX *ctx = (PROV_AES_OCB_CTX *)vctx;

    if (!ossl_prov_is_running())
        return 0;

    if (outsize < inl) {
        ERR_raise(ERR_LIB_PROV, PROV_R_OUTPUT_BUFFER_TOO_SMALL);
        return 0;
    }

    if (!aes_generic_ocb_cipher(ctx, in, out, inl)) {
        ERR_raise(ERR_LIB_PROV, PROV_R_CIPHER_OPERATION_FAILED);
        return 0;
    }

    *outl = inl;
    return 1;
}